

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Aig_Man_t * Abc_NtkToDarChoices(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  void *pvVar3;
  long *plVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *p;
  char *pcVar7;
  Aig_Obj_t **ppAVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  Aig_Man_t *pAVar13;
  long lVar14;
  
  pVVar6 = Abc_AigDfs(pNtk,0,0);
  p = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  iVar5 = pNtk->nBarBufs;
  p->nConstrs = pNtk->nConstrs;
  p->nBarBufs = iVar5;
  pcVar7 = Extra_UtilStrsav(pNtk->pName);
  p->pName = pcVar7;
  pcVar7 = Extra_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar7;
  iVar5 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar5 != 0) {
    ppAVar8 = (Aig_Obj_t **)calloc(1,(long)pNtk->nObjs << 3);
    p->pEquivs = ppAVar8;
  }
  aVar2 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->field_6 = aVar2;
  pVVar10 = pNtk->vCis;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar14];
      pAVar11 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar3 + 0x40) = pAVar11;
      lVar14 = lVar14 + 1;
      pVVar10 = pNtk->vCis;
    } while (lVar14 < pVVar10->nSize);
  }
  if (0 < pVVar6->nSize) {
    lVar14 = 0;
    do {
      plVar4 = (long *)pVVar6->pArray[lVar14];
      lVar12 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
      pAVar11 = Aig_And(p,(Aig_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(lVar12 + (long)*(int *)plVar4[4] * 8) + 0x40)),
                        (Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 0xb & 1) ^
                        *(ulong *)(*(long *)(lVar12 + (long)((int *)plVar4[4])[1] * 8) + 0x40)));
      plVar4[8] = (long)pAVar11;
      if (((ulong)plVar4 & 1) != 0) {
        pcVar7 = "!Abc_ObjIsComplement(pNode)";
LAB_0024776e:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (*(int *)*plVar4 != 3) {
        pcVar7 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_0024776e;
      }
      lVar12 = plVar4[7];
      if ((lVar12 != 0) && (0 < *(int *)((long)plVar4 + 0x2c))) {
        do {
          if (p->pEquivs == (Aig_Obj_t **)0x0) {
            __assert_fail("p->pEquivs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x149,"void Aig_ObjSetEquiv(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          piVar1 = &pAVar11->Id;
          pAVar11 = *(Aig_Obj_t **)(lVar12 + 0x40);
          p->pEquivs[*piVar1] = pAVar11;
          lVar12 = *(long *)(lVar12 + 0x38);
        } while (lVar12 != 0);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar14 = 0;
    do {
      plVar4 = (long *)pVVar6->pArray[lVar14];
      Aig_ObjCreateCo(p,(Aig_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                            (long)*(int *)plVar4[4] * 8) + 0x40)));
      lVar14 = lVar14 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar14 < pVVar6->nSize);
  }
  Aig_ManSetRegNum(p,0);
  pAVar13 = p;
  iVar5 = Aig_ManCheck(p);
  if (iVar5 == 0) {
    Abc_Print((int)pAVar13,"Abc_NtkToDar: AIG check has failed.\n");
    Aig_ManStop(p);
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Abc_NtkToDarChoices( Abc_Ntk_t * pNtk )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pPrev, * pFanin;
    Vec_Ptr_t * vNodes;
    int i;
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        pMan->pEquivs = ABC_ALLOC( Aig_Obj_t *, Abc_NtkObjNum(pNtk) );
        memset( pMan->pEquivs, 0, sizeof(Aig_Obj_t *) * Abc_NtkObjNum(pNtk) );
    }
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // perform the conversion of the internal nodes (assumes DFS ordering)
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
        if ( Abc_AigNodeIsChoice( pObj ) )
        {
            for ( pPrev = pObj, pFanin = (Abc_Obj_t *)pObj->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
                Aig_ObjSetEquiv( pMan, (Aig_Obj_t *)pPrev->pCopy, (Aig_Obj_t *)pFanin->pCopy );
//            Aig_ManCreateChoice( pIfMan, (Aig_Obj_t *)pNode->pCopy );
        }
    }
    Vec_PtrFree( vNodes );
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, 0 );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}